

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O0

BoundingBox * __thiscall draco::PointCloud::ComputeBoundingBox(PointCloud *this)

{
  bool bVar1;
  AttributeValueIndex att_index;
  PointAttribute *this_00;
  size_t sVar2;
  GeometryAttribute *in_RSI;
  BoundingBox *in_RDI;
  AttributeValueIndex i;
  Vector3f p;
  PointAttribute *pc_att;
  BoundingBox *bounding_box;
  Type in_stack_ffffffffffffffac;
  PointCloud *in_stack_ffffffffffffffb0;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> IVar3;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_28 [2];
  BoundingBox *in_stack_ffffffffffffffe0;
  
  BoundingBox::BoundingBox(in_stack_ffffffffffffffe0);
  this_00 = GetNamedAttribute(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  if (this_00 != (PointAttribute *)0x0) {
    VectorD<float,_3>::VectorD((VectorD<float,_3> *)in_stack_ffffffffffffffb0);
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(local_28,0);
    while( true ) {
      sVar2 = PointAttribute::size(this_00);
      att_index.value_ = (uint)sVar2;
      bVar1 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator<
                        (local_28,(uint *)&stack0xffffffffffffffd4);
      if (!bVar1) break;
      IVar3.value_ = local_28[0].value_;
      VectorD<float,_3>::operator[]((VectorD<float,_3> *)this_00,in_stack_ffffffffffffffac);
      GeometryAttribute::GetValue(in_RSI,att_index,in_RDI);
      BoundingBox::Update((BoundingBox *)CONCAT44(att_index.value_,IVar3.value_),(Vector3f *)in_RSI)
      ;
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(local_28);
    }
  }
  return in_RDI;
}

Assistant:

BoundingBox PointCloud::ComputeBoundingBox() const {
  BoundingBox bounding_box;
  auto pc_att = GetNamedAttribute(GeometryAttribute::POSITION);
  if (pc_att == nullptr) {
    // Return default invalid bounding box.
    return bounding_box;
  }

  // TODO(b/199760503): Make the BoundingBox a template type, it may not be easy
  // because PointCloud is not a template.
  // Or simply add some preconditioning here to make sure the position attribute
  // is valid, because the current code works only if the position attribute is
  // defined with 3 components of DT_FLOAT32.
  // Consider using pc_att->ConvertValue<float, 3>(i, &p[0]) (Enforced
  // transformation from Vector with any dimension to Vector3f)
  Vector3f p;
  for (AttributeValueIndex i(0); i < static_cast<uint32_t>(pc_att->size());
       ++i) {
    pc_att->GetValue(i, &p[0]);
    bounding_box.Update(p);
  }
  return bounding_box;
}